

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * lowerCase(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string lowerCase (const std::string& input)
{
  std::string output = input;
  std::transform (output.begin (), output.end (), output.begin (), tolower);
  return output;
}